

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O1

void duckdb::ArgMinMaxBase<duckdb::LessThan,true>::
     Operation<duckdb::hugeint_t,double,duckdb::ArgMinMaxState<duckdb::hugeint_t,double>,duckdb::ArgMinMaxBase<duckdb::LessThan,true>>
               (ArgMinMaxState<duckdb::hugeint_t,_double> *state,hugeint_t *x,double *y,
               AggregateBinaryInput *binary)

{
  int64_t iVar1;
  bool bVar2;
  double local_20;
  uint64_t local_18;
  int64_t iStack_10;
  
  if ((state->super_ArgMinMaxStateBase).is_initialized == false) {
    iVar1 = x->upper;
    (state->arg).lower = x->lower;
    (state->arg).upper = iVar1;
    state->value = *y;
    (state->super_ArgMinMaxStateBase).is_initialized = true;
  }
  else {
    local_18 = x->lower;
    iStack_10 = x->upper;
    local_20 = *y;
    bVar2 = GreaterThan::Operation<double>(&state->value,&local_20);
    if (bVar2) {
      (state->arg).lower = local_18;
      (state->arg).upper = iStack_10;
      state->value = local_20;
    }
  }
  return;
}

Assistant:

static void Operation(STATE &state, const A_TYPE &x, const B_TYPE &y, AggregateBinaryInput &binary) {
		if (!state.is_initialized) {
			if (IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) {
				Assign(state, x, y, !binary.left_mask.RowIsValid(binary.lidx));
				state.is_initialized = true;
			}
		} else {
			OP::template Execute<A_TYPE, B_TYPE, STATE>(state, x, y, binary);
		}
	}